

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts_tclap.cpp
# Opt level: O2

TEvalOpts * ParseOptions(TEvalOpts *__return_storage_ptr__,int argc,char **argv)

{
  allocator<char> local_8fb;
  allocator<char> local_8fa;
  allocator<char> local_8f9;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  SwitchArg printArg;
  SwitchArg useDoubleArg;
  SwitchArg noDenormalsArg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  SwitchArg exactArg;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> archArg
  ;
  ValueArg<unsigned_long> nArg;
  CmdLine cmd;
  ValueArg<float> maxArg;
  ValueArg<float> minArg;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> funcArg
  ;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcArg,"Compute <count> values of a <func> in [<min>, <max>] interval",
             (allocator<char> *)&nArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&archArg,"none",(allocator<char> *)&minArg);
  TCLAP::CmdLine::CmdLine(&cmd,(string *)&funcArg,' ',(string *)&archArg,true);
  std::__cxx11::string::~string((string *)&archArg);
  std::__cxx11::string::~string((string *)&funcArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&archArg,"",(allocator<char> *)&exactArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nArg,"func",(allocator<char> *)&noDenormalsArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&minArg,"exp or log or sigm or tanh",(allocator<char> *)&useDoubleArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_680,"exp",(allocator<char> *)&printArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&maxArg,"exp|log|sigm|tanh",(allocator<char> *)&local_8f8);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&funcArg,(string *)&archArg,(string *)&nArg,(string *)&minArg,true,&local_680,
             (string *)&maxArg,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&maxArg);
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::~string((string *)&minArg);
  std::__cxx11::string::~string((string *)&nArg);
  std::__cxx11::string::~string((string *)&archArg);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&funcArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&archArg,"",(allocator<char> *)&noDenormalsArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nArg,"min",(allocator<char> *)&useDoubleArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&maxArg,"Lower boundary of an interval, default is -100.0",
             (allocator<char> *)&printArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&exactArg,"FLOAT",(allocator<char> *)&local_8f8);
  TCLAP::ValueArg<float>::ValueArg
            (&minArg,(string *)&archArg,(string *)&nArg,(string *)&maxArg,false,-100.0,
             (string *)&exactArg,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&exactArg);
  std::__cxx11::string::~string((string *)&maxArg);
  std::__cxx11::string::~string((string *)&nArg);
  std::__cxx11::string::~string((string *)&archArg);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&minArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&archArg,"",(allocator<char> *)&useDoubleArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nArg,"max",(allocator<char> *)&printArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&exactArg,"Upper boundary of an interval, default is 100.0",
             (allocator<char> *)&local_8f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&noDenormalsArg,"FLOAT",(allocator<char> *)&local_8d8);
  TCLAP::ValueArg<float>::ValueArg
            (&maxArg,(string *)&archArg,(string *)&nArg,(string *)&exactArg,false,100.0,
             (string *)&noDenormalsArg,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&noDenormalsArg);
  std::__cxx11::string::~string((string *)&exactArg);
  std::__cxx11::string::~string((string *)&nArg);
  std::__cxx11::string::~string((string *)&archArg);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&maxArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&archArg,"c",(allocator<char> *)&printArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&exactArg,"count",(allocator<char> *)&local_8f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&noDenormalsArg,"Number of values to compute, default is 1000",
             (allocator<char> *)&local_8d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&useDoubleArg,"N",(allocator<char> *)&local_8b8);
  TCLAP::ValueArg<unsigned_long>::ValueArg
            (&nArg,(string *)&archArg,(string *)&exactArg,(string *)&noDenormalsArg,false,1000,
             (string *)&useDoubleArg,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&useDoubleArg);
  std::__cxx11::string::~string((string *)&noDenormalsArg);
  std::__cxx11::string::~string((string *)&exactArg);
  std::__cxx11::string::~string((string *)&archArg);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&nArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&exactArg,"",(allocator<char> *)&local_8f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&noDenormalsArg,"arch",(allocator<char> *)&local_8d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&useDoubleArg,"Target archicture: plain or avx or avx2, default is avx2",
             (allocator<char> *)&local_8b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"avx2",&local_8fb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&printArg,"plain|avx|avx2",&local_8fa);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&archArg,(string *)&exactArg,(string *)&noDenormalsArg,(string *)&useDoubleArg,false,
             &local_6a0,(string *)&printArg,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&printArg);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::__cxx11::string::~string((string *)&useDoubleArg);
  std::__cxx11::string::~string((string *)&noDenormalsArg);
  std::__cxx11::string::~string((string *)&exactArg);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&archArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&noDenormalsArg,"",(allocator<char> *)&local_8f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&useDoubleArg,"exact",(allocator<char> *)&local_8d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&printArg,"Use exact version (slower)",(allocator<char> *)&local_8b8);
  TCLAP::SwitchArg::SwitchArg
            (&exactArg,(string *)&noDenormalsArg,(string *)&useDoubleArg,(string *)&printArg,
             &cmd.super_CmdLineInterface,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&printArg);
  std::__cxx11::string::~string((string *)&useDoubleArg);
  std::__cxx11::string::~string((string *)&noDenormalsArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&useDoubleArg,"",(allocator<char> *)&local_8d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&printArg,"nodenorm",(allocator<char> *)&local_8b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f8,"Don\'t honor denormals",&local_8fb);
  TCLAP::SwitchArg::SwitchArg
            (&noDenormalsArg,(string *)&useDoubleArg,(string *)&printArg,&local_8f8,
             &cmd.super_CmdLineInterface,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&printArg);
  std::__cxx11::string::~string((string *)&useDoubleArg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&printArg,"",(allocator<char> *)&local_8b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f8,"double",&local_8fb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d8,"Use double precision, single precision is used by default",
             &local_8fa);
  TCLAP::SwitchArg::SwitchArg
            (&useDoubleArg,(string *)&printArg,&local_8f8,&local_8d8,&cmd.super_CmdLineInterface,
             false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&printArg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f8,"",&local_8fb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"print",&local_8fa);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b8,"",&local_8f9);
  TCLAP::SwitchArg::SwitchArg
            (&printArg,&local_8f8,&local_8d8,&local_8b8,&cmd.super_CmdLineInterface,false,
             (Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8f8);
  TCLAP::CmdLine::parse(&cmd,argc,argv);
  (__return_storage_ptr__->Func)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Func).field_2
  ;
  (__return_storage_ptr__->Func)._M_string_length = 0;
  (__return_storage_ptr__->Func).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Arch)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Arch).field_2
  ;
  (__return_storage_ptr__->Arch)._M_string_length = 0;
  (__return_storage_ptr__->Arch).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->Lo = (float)minArg.super_Arg._164_4_;
  __return_storage_ptr__->Hi = (float)maxArg.super_Arg._164_4_;
  __return_storage_ptr__->N = nArg._value;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->Arch);
  __return_storage_ptr__->Exact = (bool)exactArg.super_Arg._163_1_;
  __return_storage_ptr__->NoDenormals = (bool)noDenormalsArg.super_Arg._163_1_;
  __return_storage_ptr__->UseDouble = (bool)useDoubleArg.super_Arg._163_1_;
  __return_storage_ptr__->Print = (bool)printArg.super_Arg._163_1_;
  TCLAP::Arg::~Arg(&printArg.super_Arg);
  TCLAP::Arg::~Arg(&useDoubleArg.super_Arg);
  TCLAP::Arg::~Arg(&noDenormalsArg.super_Arg);
  TCLAP::Arg::~Arg(&exactArg.super_Arg);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&archArg);
  TCLAP::ValueArg<unsigned_long>::~ValueArg(&nArg);
  TCLAP::ValueArg<float>::~ValueArg(&maxArg);
  TCLAP::ValueArg<float>::~ValueArg(&minArg);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&funcArg);
  TCLAP::CmdLine::~CmdLine(&cmd);
  return __return_storage_ptr__;
}

Assistant:

TEvalOpts ParseOptions(int argc, char** argv) {
    TCLAP::CmdLine cmd("Compute <count> values of a <func> in [<min>, <max>] interval");
    TCLAP::ValueArg<std::string> funcArg("", "func", "exp or log or sigm or tanh", true, "exp", "exp|log|sigm|tanh");
    cmd.add(funcArg);
    TCLAP::ValueArg<float> minArg("", "min", "Lower boundary of an interval, default is -100.0", false, -100.0, "FLOAT");
    cmd.add(minArg);
    TCLAP::ValueArg<float> maxArg("", "max", "Upper boundary of an interval, default is 100.0", false, 100.0, "FLOAT");
    cmd.add(maxArg);
    TCLAP::ValueArg<size_t> nArg("c", "count", "Number of values to compute, default is 1000", false, 1000, "N");
    cmd.add(nArg);
    TCLAP::ValueArg<std::string> archArg("", "arch", "Target archicture: plain or avx or avx2, default is avx2", false, "avx2", "plain|avx|avx2");
    cmd.add(archArg);
    TCLAP::SwitchArg exactArg("", "exact", "Use exact version (slower)", cmd, false);
    TCLAP::SwitchArg noDenormalsArg("", "nodenorm", "Don't honor denormals", cmd, false);
    TCLAP::SwitchArg useDoubleArg("", "double", "Use double precision, single precision is used by default", cmd, false);
    TCLAP::SwitchArg printArg("", "print", "", cmd, false);
    cmd.parse(argc, argv);

    TEvalOpts res; 

    res.Func = funcArg.getValue();
    res.Lo = minArg.getValue();
    res.Hi = maxArg.getValue();
    res.N = nArg.getValue();
    res.Arch = archArg.getValue();
    res.Exact = exactArg.getValue();
    res.NoDenormals = noDenormalsArg.getValue();
    res.UseDouble = useDoubleArg.getValue();
    res.Print = printArg.getValue();

    return res;
}